

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void mp::format(BasicFormatter<char,_fmt::ArgFormatter<char>_> *f,char **param_2,NumericExpr e)

{
  char *__src;
  size_t __n;
  Buffer<char> *pBVar1;
  ptrdiff_t _Num;
  ulong uVar2;
  char *str;
  MemoryWriter writer;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> local_270;
  Writer local_258;
  Buffer<char> local_248;
  char local_228 [504];
  
  local_258.buffer_ = &local_248;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_001a96a8;
  local_248.ptr_ = local_228;
  local_248.size_ = 0;
  local_248.capacity_ = 500;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_001a9710;
  local_270.
  super_BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>,_void,_mp::internal::ExprTypes>
  ._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicExprVisitor_001aa788;
  local_270.writer_ = &local_258;
  local_270.precedence_ = 0;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            (&local_270,(NumericExpr)e.super_ExprBase.impl_,-1);
  __src = (local_258.buffer_)->ptr_;
  __n = (local_258.buffer_)->size_;
  pBVar1 = f->writer_->buffer_;
  uVar2 = pBVar1->size_ + __n;
  if (pBVar1->capacity_ < uVar2) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar2);
  }
  if (__n != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,__src,__n);
  }
  pBVar1->size_ = uVar2;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_001a96a8;
  local_248._vptr_Buffer = (_func_int **)&PTR_grow_001a9710;
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
  }
  return;
}

Assistant:

void mp::format(fmt::BasicFormatter<char> &f, const char *&, NumericExpr e) {
  fmt::MemoryWriter writer;
  ExprWriter<internal::ExprTypes>(writer).Visit(e);
  f.writer() << fmt::StringRef(writer.data(), writer.size());
}